

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

TileCoord __thiscall Imf_3_4::TiledOutputFile::Data::nextTileCoord(Data *this,TileCoord *a)

{
  LevelMode LVar1;
  ArgExc *this_00;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong in_RDX;
  uint uVar5;
  TileCoord *pTVar6;
  ulong uVar7;
  TileCoord TVar8;
  
  uVar3 = (ulong)a >> 0x20;
  iVar4 = (int)in_RDX;
  iVar2 = (int)((ulong)a >> 0x20);
  if (this->lineOrder == DECREASING_Y) {
    uVar5 = (int)a + 1;
    pTVar6 = (TileCoord *)(ulong)uVar5;
    if (this->numXTiles[iVar4] <= (int)uVar5) {
      pTVar6 = (TileCoord *)0x0;
      if (iVar2 == 0 || (long)a < 0) {
        LVar1 = (this->tileDesc).mode;
        if (LVar1 < RIPMAP_LEVELS) {
          in_RDX = (in_RDX & 0xffffffff00000000 | (ulong)(iVar4 + 1)) + 0x100000000;
        }
        else if (LVar1 == RIPMAP_LEVELS) {
          uVar3 = in_RDX + 1;
          uVar7 = in_RDX & 0xffffffff00000000;
          in_RDX = uVar7 + 0x100000000;
          if ((int)uVar3 < this->numXLevels) {
            in_RDX = uVar3 & 0xffffffff | uVar7;
          }
        }
        else if (LVar1 == NUM_LEVELMODES) {
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Invalid tile description");
          goto LAB_001aa4fe;
        }
        if ((int)(in_RDX >> 0x20) < this->numYLevels) {
          uVar3 = (ulong)(this->numYTiles[(long)in_RDX >> 0x20] - 1);
          goto LAB_001aa5dd;
        }
      }
      uVar3 = (ulong)(iVar2 - 1);
    }
  }
  else {
    pTVar6 = a;
    if ((this->lineOrder == INCREASING_Y) &&
       (uVar5 = (int)a + 1, pTVar6 = (TileCoord *)(ulong)uVar5, this->numXTiles[iVar4] <= (int)uVar5
       )) {
      uVar3 = (ulong)(iVar2 + 1U);
      pTVar6 = (TileCoord *)0x0;
      if (this->numYTiles[(long)in_RDX >> 0x20] <= (int)(iVar2 + 1U)) {
        LVar1 = (this->tileDesc).mode;
        pTVar6 = (TileCoord *)0x0;
        if (LVar1 < RIPMAP_LEVELS) {
          in_RDX = (in_RDX & 0xffffffff00000000 | (ulong)(iVar4 + 1)) + 0x100000000;
        }
        else {
          if (LVar1 != RIPMAP_LEVELS) {
            uVar3 = 0;
            pTVar6 = (TileCoord *)0x0;
            if (LVar1 == NUM_LEVELMODES) {
              this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::ArgExc::ArgExc(this_00,"Invalid tile description");
LAB_001aa4fe:
              __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
            }
            goto LAB_001aa5dd;
          }
          uVar3 = in_RDX + 1;
          uVar7 = in_RDX & 0xffffffff00000000;
          in_RDX = uVar7 + 0x100000000;
          if ((int)uVar3 < this->numXLevels) {
            in_RDX = uVar3 & 0xffffffff | uVar7;
          }
        }
        uVar3 = 0;
      }
    }
  }
LAB_001aa5dd:
  TVar8._0_8_ = (ulong)pTVar6 & 0xffffffff | uVar3 << 0x20;
  TVar8.lx = (int)in_RDX;
  TVar8.ly = (int)(in_RDX >> 0x20);
  return TVar8;
}

Assistant:

TileCoord
TiledOutputFile::Data::nextTileCoord (const TileCoord& a)
{
    TileCoord b = a;

    if (lineOrder == INCREASING_Y)
    {
        b.dx++;

        if (b.dx >= numXTiles[b.lx])
        {
            b.dx = 0;
            b.dy++;

            if (b.dy >= numYTiles[b.ly])
            {
                //
                // the next tile is in the next level
                //

                b.dy = 0;

                switch (tileDesc.mode)
                {
                    case ONE_LEVEL:
                    case MIPMAP_LEVELS:

                        b.lx++;
                        b.ly++;
                        break;

                    case RIPMAP_LEVELS:

                        b.lx++;

                        if (b.lx >= numXLevels)
                        {
                            b.lx = 0;
                            b.ly++;

#ifdef DEBUG
                            assert (b.ly <= numYLevels);
#endif
                        }
                        break;
                    case NUM_LEVELMODES:
                        throw (
                            IEX_NAMESPACE::ArgExc ("Invalid tile description"));
                }
            }
        }
    }
    else if (lineOrder == DECREASING_Y)
    {
        b.dx++;

        if (b.dx >= numXTiles[b.lx])
        {
            b.dx = 0;
            b.dy--;

            if (b.dy < 0)
            {
                //
                // the next tile is in the next level
                //

                switch (tileDesc.mode)
                {
                    case ONE_LEVEL:
                    case MIPMAP_LEVELS:

                        b.lx++;
                        b.ly++;
                        break;

                    case RIPMAP_LEVELS:

                        b.lx++;

                        if (b.lx >= numXLevels)
                        {
                            b.lx = 0;
                            b.ly++;

#ifdef DEBUG
                            assert (b.ly <= numYLevels);
#endif
                        }
                        break;
                    case NUM_LEVELMODES:
                        throw (
                            IEX_NAMESPACE::ArgExc ("Invalid tile description"));
                }

                if (b.ly < numYLevels) b.dy = numYTiles[b.ly] - 1;
            }
        }
    }

    return b;
}